

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pub.hpp
# Opt level: O0

queue_params_t * __thiscall
so_5::disp::mpsc_queue_traits::queue_params_t::operator=(queue_params_t *this,queue_params_t *o)

{
  undefined1 local_38 [8];
  queue_params_t tmp;
  queue_params_t *o_local;
  queue_params_t *this_local;
  
  tmp.m_lock_factory._M_invoker = (_Invoker_type)o;
  queue_params_t((queue_params_t *)local_38,o);
  mpsc_queue_traits::swap(this,(queue_params_t *)local_38);
  ~queue_params_t((queue_params_t *)local_38);
  return this;
}

Assistant:

queue_params_t & operator=( queue_params_t && o )
			{
				queue_params_t tmp{ std::move(o) };
				swap( *this, tmp );
				return *this;
			}